

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O0

int func_extract(int ip)

{
  bool bVar1;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  int local_28;
  int end;
  int max_arg;
  int arg;
  int i;
  char c;
  char *ptr;
  int ip_local;
  
  ptr._0_4_ = ip;
  while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)prlnbuf[(int)ptr]] & 0x2000) != 0) {
    ptr._0_4_ = (int)ptr + 1;
  }
  _i = func_line;
  local_28 = 0;
  bVar1 = false;
  max_arg = 0;
  do {
    if (bVar1) {
      return local_28;
    }
    iVar2 = (int)ptr + 1;
    arg._3_1_ = prlnbuf[(int)ptr];
    if ((arg._3_1_ == '\0') || (arg._3_1_ == ';')) {
      *_i = '\0';
      bVar1 = true;
      ptr._0_4_ = iVar2;
    }
    else {
      if (arg._3_1_ == '\\') {
        pcVar4 = _i + 1;
        *_i = '\\';
        max_arg = max_arg + 1;
        arg._3_1_ = prlnbuf[iVar2];
        if ((arg._3_1_ < '1') || ('9' < arg._3_1_)) {
          error("Invalid function argument!");
          return -1;
        }
        _i = pcVar4;
        iVar2 = (int)ptr + 2;
        if (local_28 < arg._3_1_ + -0x31) {
          local_28 = arg._3_1_ + -0x31;
        }
      }
      ptr._0_4_ = iVar2;
      *_i = arg._3_1_;
      max_arg = max_arg + 1;
      if (max_arg == 0x7f) {
        error("Function line too long!");
        return -1;
      }
    }
    _i = _i + 1;
  } while( true );
}

Assistant:

int
func_extract(int ip)
{
	char *ptr;
	char  c;
	int   i, arg, max_arg;
	int   end;

	/* skip spaces */
	while (isspace(prlnbuf[ip]))
		ip++;

	/* get function body */
	ptr = func_line;
	max_arg = 0;
	end = 0;
	i = 0;

	while (!end) {
		c = prlnbuf[ip++];
		switch (c) {
		/* end of line */	
		case ';':
		case '\0':
		   *ptr++ = '\0';
			end = 1;
			break;

		/* function arg */
		case '\\':
		   *ptr++ = c;
		    i++;
			c = prlnbuf[ip++];
			if ((c < '1') || (c > '9')) {
				error("Invalid function argument!");
				return (-1);
			}
			arg = c - '1';
			if (max_arg < arg)
				max_arg = arg;

		/* other */
		default:
		   *ptr++ = c;
		    i++;
			if (i == 127) {
				error("Function line too long!");
				return (-1);
			}
			break;
		}
	}

	/* return the number of args */
	return (max_arg);
}